

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_sparse_length.c
# Opt level: O1

void test_read_format_gtar_sparse_length(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  archive_entry *ae;
  archive_entry *local_30;
  
  extract_reference_file("test_read_format_gtar_sparse_length.tar.Z");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_length.c"
                   ,L'%',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_length.c"
                   ,L'&',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",(void *)0x0);
  wVar2 = archive_read_support_format_tar((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_length.c"
                   ,L'\'',(uint)(wVar2 == L'\0'),"0 == archive_read_support_format_tar(a)",
                   (void *)0x0);
  failure("Can\'t open %s","test_read_format_gtar_sparse_length.tar.Z");
  wVar2 = archive_read_open_filename(a,"test_read_format_gtar_sparse_length.tar.Z",3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_length.c"
                   ,L')',(uint)(wVar2 == L'\0'),"0 == archive_read_open_filename(a, refname, 3)",
                   (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_length.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"err",a);
  iVar1 = archive_read_next_header((archive *)a,&local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_length.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar1,"err",a);
  iVar1 = archive_read_next_header((archive *)a,&local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_length.c"
                      ,L'1',1,"ARCHIVE_EOF",(long)iVar1,"err",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_length.c"
                      ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_length.c"
                      ,L'4',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_sparse_length)
{
	const char *refname = "test_read_format_gtar_sparse_length.tar.Z";
	int err;
	struct archive *a;
	struct archive_entry *ae;

	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assert(0 == archive_read_support_filter_all(a));
	assert(0 == archive_read_support_format_tar(a));
	failure("Can't open %s", refname);
	assert(0 == archive_read_open_filename(a, refname, 3));

	err = archive_read_next_header(a, &ae);
	assertEqualIntA(a, ARCHIVE_OK, err);
	err = archive_read_next_header(a, &ae);
	assertEqualIntA(a, ARCHIVE_OK, err);

	err = archive_read_next_header(a, &ae);
	assertEqualIntA(a, ARCHIVE_EOF, err);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}